

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O0

int MemHashAppend(unqlite_kv_engine *pKv,void *pKey,int nKeyLen,void *pData,unqlite_int64 nDataLen)

{
  sxu32 sVar1;
  mem_hash_record *pmVar2;
  long lVar3;
  void *pvVar4;
  char *zNew;
  sxu32 nData;
  void *pOld;
  unqlite_int64 nNew;
  mem_hash_record *pRecord;
  mem_hash_kv_engine *pEngine;
  unqlite_int64 nDataLen_local;
  void *pData_local;
  int nKeyLen_local;
  void *pKey_local;
  unqlite_kv_engine *pKv_local;
  
  if (0xffffffff < nDataLen) {
    (*pKv->pIo->xErr)(pKv->pIo->pHandle,"Record size limit reached");
    return -7;
  }
  pmVar2 = MemHashGetEntry((mem_hash_kv_engine *)pKv,pKey,nKeyLen);
  if (pmVar2 == (mem_hash_record *)0x0) {
    sVar1 = (*(code *)pKv[0x18].pIo)(pKey,nKeyLen);
    pmVar2 = MemHashNewRecord((mem_hash_kv_engine *)pKv,pKey,nKeyLen,pData,nDataLen,sVar1);
    if (pmVar2 == (mem_hash_record *)0x0) {
      return -1;
    }
    MemHashLinkRecord((mem_hash_kv_engine *)pKv,pmVar2);
    if ((*(uint *)((long)&pKv[0x1a].pIo + 4) <= (uint)(*(int *)&pKv[0x1a].pIo << 2)) &&
       (*(uint *)&pKv[0x1a].pIo < 100000)) {
      MemHashGrowTable((mem_hash_kv_engine *)pKv);
    }
  }
  else {
    lVar3 = (ulong)pmVar2->nDataLen + nDataLen;
    if (0xffffffff < lVar3) {
      (*pKv->pIo->xErr)(pKv->pIo->pHandle,"Append operation will cause data overflow");
      return -7;
    }
    sVar1 = (sxu32)lVar3;
    pvVar4 = SyMemBackendRealloc((SyMemBackend *)(pKv + 1),pmVar2->pData,sVar1);
    if (pvVar4 == (void *)0x0) {
      return -1;
    }
    SyMemcpy(pData,(void *)((long)pvVar4 + (ulong)pmVar2->nDataLen),(sxu32)nDataLen);
    pmVar2->pData = pvVar4;
    pmVar2->nDataLen = sVar1;
  }
  return 0;
}

Assistant:

static int MemHashAppend(
	  unqlite_kv_engine *pKv,
	  const void *pKey,int nKeyLen,
	  const void *pData,unqlite_int64 nDataLen
	  )
{
	mem_hash_kv_engine *pEngine = (mem_hash_kv_engine *)pKv;
	mem_hash_record *pRecord;
	if( nDataLen > SXU32_HIGH ){
		/* Database limit */
		pEngine->pIo->xErr(pEngine->pIo->pHandle,"Record size limit reached");
		return UNQLITE_LIMIT;
	}
	/* Fetch the record first */
	pRecord = MemHashGetEntry(pEngine,pKey,nKeyLen);
	if( pRecord == 0 ){
		/* Allocate a new record */
		pRecord = MemHashNewRecord(pEngine,
			pKey,nKeyLen,
			pData,nDataLen,
			pEngine->xHash(pKey,nKeyLen)
			);
		if( pRecord == 0 ){
			return UNQLITE_NOMEM;
		}
		/* Link the entry */
		MemHashLinkRecord(pEngine,pRecord);
		if( pEngine->nRecord * MEM_HASH_FILL_FACTOR >= pEngine->nBucket && pEngine->nRecord < 100000 ){
			/* Rehash the table */
			MemHashGrowTable(pEngine);
		}
	}else{
		unqlite_int64 nNew = pRecord->nDataLen + nDataLen;
		void *pOld = (void *)pRecord->pData;
		sxu32 nData;
		char *zNew;
		/* Append data to the existing record */
		if( nNew > SXU32_HIGH ){
			/* Overflow */
			pEngine->pIo->xErr(pEngine->pIo->pHandle,"Append operation will cause data overflow");	
			return UNQLITE_LIMIT;
		}
		nData = (sxu32)nNew;
		/* Allocate bigger chunk */
		zNew = (char *)SyMemBackendRealloc(&pEngine->sAlloc,pOld,nData);
		if( zNew == 0 ){
			return UNQLITE_NOMEM;
		}
		/* Reflect the change */
		SyMemcpy(pData,&zNew[pRecord->nDataLen],(sxu32)nDataLen);
		pRecord->pData = (const void *)zNew;
		pRecord->nDataLen = nData;
	}
	return UNQLITE_OK;
}